

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac.c
# Opt level: O2

_Bool duckdb_je_pac_decay_ms_set
                (tsdn_t *tsdn,pac_t *pac,extent_state_t state,ssize_t decay_ms,
                pac_purge_eagerness_t eagerness)

{
  pac_stats_t *decay_stats;
  decay_t *decay;
  _Bool _Var1;
  ecache_t *ecache;
  nstime_t cur_time;
  nstime_t local_38;
  
  decay_stats = pac->stats;
  _Var1 = duckdb_je_decay_ms_valid(decay_ms);
  if (_Var1) {
    decay = &pac->decay_dirty;
    ecache = &pac->ecache_dirty;
    if (state != extent_state_dirty) {
      ecache = &pac->ecache_muzzy;
      decay = &pac->decay_muzzy;
      decay_stats = (pac_stats_t *)&decay_stats->decay_muzzy;
    }
    malloc_mutex_lock(tsdn,&decay->mtx);
    duckdb_je_nstime_init_update(&local_38);
    duckdb_je_decay_reinit(decay,&local_38,decay_ms);
    duckdb_je_pac_maybe_decay_purge(tsdn,pac,decay,&decay_stats->decay_dirty,ecache,eagerness);
    (decay->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(decay->mtx).field_0 + 0x48));
  }
  return !_Var1;
}

Assistant:

bool
pac_decay_ms_set(tsdn_t *tsdn, pac_t *pac, extent_state_t state,
    ssize_t decay_ms, pac_purge_eagerness_t eagerness) {
	decay_t *decay;
	pac_decay_stats_t *decay_stats;
	ecache_t *ecache;
	pac_decay_data_get(pac, state, &decay, &decay_stats, &ecache);

	if (!decay_ms_valid(decay_ms)) {
		return true;
	}

	malloc_mutex_lock(tsdn, &decay->mtx);
	/*
	 * Restart decay backlog from scratch, which may cause many dirty pages
	 * to be immediately purged.  It would conceptually be possible to map
	 * the old backlog onto the new backlog, but there is no justification
	 * for such complexity since decay_ms changes are intended to be
	 * infrequent, either between the {-1, 0, >0} states, or a one-time
	 * arbitrary change during initial arena configuration.
	 */
	nstime_t cur_time;
	nstime_init_update(&cur_time);
	decay_reinit(decay, &cur_time, decay_ms);
	pac_maybe_decay_purge(tsdn, pac, decay, decay_stats, ecache, eagerness);
	malloc_mutex_unlock(tsdn, &decay->mtx);

	return false;
}